

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O0

string * __thiscall antlr::RecognitionException::toString_abi_cxx11_(RecognitionException *this)

{
  long *in_RSI;
  string *in_RDI;
  string local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  (**(code **)(*in_RSI + 0x38))(local_30);
  (**(code **)(*in_RSI + 0x18))(local_50);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string RecognitionException::toString() const
{
	return getFileLineColumnString()+getMessage();
}